

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O3

bool __thiscall helics::Federate::isAsyncOperationCompleted(Federate *this)

{
  bool bVar1;
  future_status fVar2;
  seconds wait_delay;
  shared_handle asyncInfo;
  duration<long,_std::ratio<1L,_1L>_> local_38;
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *local_30;
  unique_lock<std::mutex> local_28;
  
  if (this->singleThreadFederate != false) {
    return false;
  }
  local_38.__r = 0;
  local_30 = (this->asyncCallInfo)._M_t.
             super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
             .
             super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
             ._M_head_impl;
  local_28._M_device = &local_30->m_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  switch((this->currentMode)._M_i) {
  case PENDING_INIT:
    fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1l>>
                      ((__basic_future<bool> *)local_30,&local_38);
    break;
  case PENDING_EXEC:
    fVar2 = std::__basic_future<helics::iteration_time>::wait_for<long,std::ratio<1l,1l>>
                      (&(local_30->m_obj).execFuture.super___basic_future<helics::iteration_time>,
                       &local_38);
    break;
  case PENDING_TIME:
    fVar2 = std::__basic_future<TimeRepresentation<count_time<9,long>>>::
            wait_for<long,std::ratio<1l,1l>>
                      ((__basic_future<TimeRepresentation<count_time<9,long>>> *)
                       &(local_30->m_obj).timeRequestFuture,&local_38);
    break;
  case PENDING_ITERATIVE_TIME:
    fVar2 = std::__basic_future<helics::iteration_time>::wait_for<long,std::ratio<1l,1l>>
                      (&(local_30->m_obj).timeRequestIterativeFuture.
                        super___basic_future<helics::iteration_time>,&local_38);
    break;
  case PENDING_FINALIZE:
    fVar2 = std::__basic_future<void>::wait_for<long,std::ratio<1l,1l>>
                      (&(local_30->m_obj).finalizeFuture.super___basic_future<void>,&local_38);
    break;
  default:
    if (*(_Manager_type *)((long)&(local_30->m_obj).asyncCheck.super__Function_base + 0x10) ==
        (_Manager_type)0x0) {
      bVar1 = false;
    }
    else {
      bVar1 = (*(local_30->m_obj).asyncCheck._M_invoker)((_Any_data *)&(local_30->m_obj).asyncCheck)
      ;
    }
    goto LAB_001c2930;
  case PENDING_ITERATIVE_INIT:
    fVar2 = std::__basic_future<void>::wait_for<long,std::ratio<1l,1l>>
                      (&(local_30->m_obj).initIterativeFuture.super___basic_future<void>,&local_38);
  }
  bVar1 = fVar2 == ready;
LAB_001c2930:
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return bVar1;
}

Assistant:

bool Federate::isAsyncOperationCompleted() const
{
    if (singleThreadFederate) {
        return false;
    }
    constexpr std::chrono::seconds wait_delay{0};
    auto ready = std::future_status::ready;

    auto asyncInfo = asyncCallInfo->lock_shared();
    switch (currentMode.load()) {
        case Modes::PENDING_INIT:
            return (asyncInfo->initFuture.wait_for(wait_delay) == ready);
        case Modes::PENDING_EXEC:
            return (asyncInfo->execFuture.wait_for(wait_delay) == ready);
        case Modes::PENDING_TIME:
            return (asyncInfo->timeRequestFuture.wait_for(wait_delay) == ready);
        case Modes::PENDING_ITERATIVE_TIME:
            return (asyncInfo->timeRequestIterativeFuture.wait_for(wait_delay) == ready);
        case Modes::PENDING_FINALIZE:
            return (asyncInfo->finalizeFuture.wait_for(wait_delay) == ready);
        case Modes::PENDING_ITERATIVE_INIT:
            return (asyncInfo->initIterativeFuture.wait_for(wait_delay) == ready);
        default:
            return (asyncInfo->asyncCheck) ? asyncInfo->asyncCheck() : false;
    }
}